

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::CloseCurrentPopup(void)

{
  ImGuiID IVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ulong uVar6;
  
  pIVar4 = GImGui;
  iVar5 = (GImGui->BeginPopupStack).Size;
  if ((0 < (long)iVar5) && (iVar5 <= (GImGui->OpenPopupStack).Size)) {
    uVar6 = (long)iVar5 - 1;
    IVar1 = (GImGui->BeginPopupStack).Data[uVar6].PopupId;
    if ((GImGui->OpenPopupStack).Size < iVar5) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    if (IVar1 == (pIVar4->OpenPopupStack).Data[uVar6].PopupId) {
      do {
        iVar5 = (int)uVar6;
        if (iVar5 < 1) {
          iVar5 = 0;
          break;
        }
        if ((pIVar4->OpenPopupStack).Size <= iVar5) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar2 = (pIVar4->OpenPopupStack).Data[uVar6 & 0xffffffff].Window;
        if ((pIVar4->OpenPopupStack).Size < iVar5) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        if ((pIVar2 == (ImGuiWindow *)0x0) || ((pIVar2->Flags & 0x10000000) == 0)) {
LAB_00212835:
          bVar3 = false;
          uVar6 = uVar6 & 0xffffffff;
        }
        else {
          pIVar2 = (pIVar4->OpenPopupStack).Data[(int)(iVar5 - 1U)].Window;
          if ((pIVar2 != (ImGuiWindow *)0x0) && ((pIVar2->Flags & 0x8000000) != 0))
          goto LAB_00212835;
          bVar3 = true;
          uVar6 = (ulong)(iVar5 - 1U);
        }
        iVar5 = (int)uVar6;
      } while (bVar3);
      ClosePopupToLevel(iVar5,true);
      if (pIVar4->NavWindow != (ImGuiWindow *)0x0) {
        (pIVar4->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;

    // Closing a menu closes its top-most parent popup (unless a modal)
    while (popup_idx > 0)
    {
        ImGuiWindow* popup_window = g.OpenPopupStack[popup_idx].Window;
        ImGuiWindow* parent_popup_window = g.OpenPopupStack[popup_idx - 1].Window;
        bool close_parent = false;
        if (popup_window && (popup_window->Flags & ImGuiWindowFlags_ChildMenu))
            if (parent_popup_window == NULL || !(parent_popup_window->Flags & ImGuiWindowFlags_Modal))
                close_parent = true;
        if (!close_parent)
            break;
        popup_idx--;
    }
    //IMGUI_DEBUG_LOG("CloseCurrentPopup %d -> %d\n", g.BeginPopupStack.Size - 1, popup_idx);
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}